

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadTuple.h
# Opt level: O1

void __thiscall QuadTuple::printWithAct(QuadTuple *this,ofstream *out)

{
  ostream *poVar1;
  
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,(this->op)._M_dataplus._M_p,(this->op)._M_string_length);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->name1)._M_dataplus._M_p,(this->name1)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->name2)._M_dataplus._M_p,(this->name2)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->res)._M_dataplus._M_p,(this->res)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void printWithAct(ofstream& out) {
        out << setw(8) << op << setw(8) << name1 << "(" << name1Act  << ")" << setw(8) << name2 << "(" << name2Act  << ")"
        << setw(8) << res << "(" << resAct  << ")" << endl;
    }